

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall
llvm::yaml::Node::Node
          (Node *this,uint Type,
          unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D,
          StringRef A,StringRef T)

{
  char *pcVar1;
  Token *pTVar2;
  
  this->_vptr_Node = (_func_int **)&PTR_anchor_00d78fc0;
  this->Doc = D;
  (this->SourceRange).Start.Ptr = (char *)0x0;
  (this->SourceRange).End.Ptr = (char *)0x0;
  this->TypeID = Type;
  (this->Anchor).Data = A.Data;
  (this->Anchor).Length = A.Length;
  (this->Tag).Data = T.Data;
  (this->Tag).Length = T.Length;
  pTVar2 = Scanner::peekNext(*(Scanner **)
                              &((D->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  pcVar1 = (pTVar2->Range).Data;
  (this->SourceRange).Start.Ptr = pcVar1;
  (this->SourceRange).End.Ptr = pcVar1;
  return;
}

Assistant:

Node::Node(unsigned int Type, std::unique_ptr<Document> &D, StringRef A,
           StringRef T)
    : Doc(D), TypeID(Type), Anchor(A), Tag(T) {
  SMLoc Start = SMLoc::getFromPointer(peekNext().Range.begin());
  SourceRange = SMRange(Start, Start);
}